

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataQueryDatumSpecification.cpp
# Opt level: O2

void __thiscall
DIS::DataQueryDatumSpecification::marshal(DataQueryDatumSpecification *this,DataStream *dataStream)

{
  pointer pUVar1;
  size_t idx;
  ulong uVar2;
  long lVar3;
  UnsignedDISInteger x;
  
  DataStream::operator<<
            (dataStream,
             (uint)((ulong)((long)(this->_fixedDatumIDList).
                                  super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->_fixedDatumIDList).
                                 super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4));
  DataStream::operator<<
            (dataStream,
             (uint)((ulong)((long)(this->_variableDatumIDList).
                                  super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->_variableDatumIDList).
                                 super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4));
  lVar3 = 8;
  for (uVar2 = 0;
      pUVar1 = (this->_fixedDatumIDList).
               super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(this->_fixedDatumIDList).
                            super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1 >> 4);
      uVar2 = uVar2 + 1) {
    x._vptr_UnsignedDISInteger = (_func_int **)&PTR__UnsignedDISInteger_001c35e0;
    x._val = *(uint *)((long)&pUVar1->_vptr_UnsignedDISInteger + lVar3);
    UnsignedDISInteger::marshal(&x,dataStream);
    UnsignedDISInteger::~UnsignedDISInteger(&x);
    lVar3 = lVar3 + 0x10;
  }
  lVar3 = 8;
  for (uVar2 = 0;
      pUVar1 = (this->_variableDatumIDList).
               super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(this->_variableDatumIDList).
                            super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1 >> 4);
      uVar2 = uVar2 + 1) {
    x._vptr_UnsignedDISInteger = (_func_int **)&PTR__UnsignedDISInteger_001c35e0;
    x._val = *(uint *)((long)&pUVar1->_vptr_UnsignedDISInteger + lVar3);
    UnsignedDISInteger::marshal(&x,dataStream);
    UnsignedDISInteger::~UnsignedDISInteger(&x);
    lVar3 = lVar3 + 0x10;
  }
  return;
}

Assistant:

void DataQueryDatumSpecification::marshal(DataStream& dataStream) const
{
    dataStream << ( unsigned int )_fixedDatumIDList.size();
    dataStream << ( unsigned int )_variableDatumIDList.size();

     for(size_t idx = 0; idx < _fixedDatumIDList.size(); idx++)
     {
        UnsignedDISInteger x = _fixedDatumIDList[idx];
        x.marshal(dataStream);
     }


     for(size_t idx = 0; idx < _variableDatumIDList.size(); idx++)
     {
        UnsignedDISInteger x = _variableDatumIDList[idx];
        x.marshal(dataStream);
     }

}